

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Cluster.c
# Opt level: O2

int Llb_ManComputeBestAttr(Llb_Mtr_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  float local_3c;
  
  lVar4 = (long)p->nCols + -1;
  uVar3 = 0xffffffff;
  local_3c = -100000.0;
  lVar7 = 2;
  for (lVar5 = 1; lVar5 < lVar4; lVar5 = lVar5 + 1) {
    for (lVar6 = lVar7; lVar6 < lVar4; lVar6 = lVar6 + 1) {
      iVar1 = p->pColSums[lVar5];
      if ((((iVar1 != 0) && (iVar2 = p->pMan->pPars->nClusterMax, iVar1 <= iVar2)) &&
          (iVar1 = p->pColSums[lVar6], iVar1 != 0)) && (iVar1 <= iVar2)) {
        fVar8 = Llb_ManComputeCommonAttr(p,(int)lVar5,(uint)lVar6);
        if (local_3c < fVar8) {
          uVar3 = (int)lVar5 << 0x10 | (uint)lVar6;
          local_3c = fVar8;
        }
      }
    }
    lVar7 = lVar7 + 1;
  }
  return uVar3;
}

Assistant:

int Llb_ManComputeBestAttr( Llb_Mtr_t * p )
{
    float WeightBest = -100000, WeightCur;
    int i, k, RetValue = -1;
    for ( i = 1; i < p->nCols-1; i++ )
    for ( k = i+1; k < p->nCols-1; k++ )
    {
        if ( p->pColSums[i] == 0 || p->pColSums[i] > p->pMan->pPars->nClusterMax )
            continue;
        if ( p->pColSums[k] == 0 || p->pColSums[k] > p->pMan->pPars->nClusterMax )
            continue;
        WeightCur = Llb_ManComputeCommonAttr( p, i, k );
        if ( WeightBest < WeightCur )
        {
            WeightBest = WeightCur;
            RetValue   = (i << 16) | k;
        }
    }
    return RetValue;
}